

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O1

void despot::DESPOT::Expand
               (QNode *qnode,ScenarioLowerBound *lb,ScenarioUpperBound *ub,DSPOMDP *model,
               RandomStreams *streams,History *history)

{
  pointer *ppiVar1;
  pointer *ppuVar2;
  State *pSVar3;
  iterator __position;
  QNode *this;
  int iVar4;
  uint uVar5;
  int iVar6;
  VNode *pVVar7;
  log_ostream *plVar8;
  ostream *poVar9;
  undefined4 extraout_var;
  vector<despot::State*,std::allocator<despot::State*>> *this_00;
  mapped_type *particles;
  mapped_type *ppVVar10;
  _Rb_tree_node_base *p_Var11;
  pointer ppSVar12;
  _Self __tmp;
  ulong uVar13;
  double dVar14;
  State *copy;
  double reward;
  OBS_TYPE obs;
  map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
  partitions;
  State *local_d0;
  double local_c8;
  double local_c0;
  QNode *local_b8;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *local_b0;
  History *local_a8;
  double local_a0;
  double local_98;
  VNode *local_90;
  RandomStreams *local_88;
  ScenarioLowerBound *local_80;
  ScenarioUpperBound *local_78;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *local_70;
  key_type local_68;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
  local_60;
  
  local_a8 = history;
  local_80 = lb;
  local_78 = ub;
  pVVar7 = QNode::parent(qnode);
  iVar4 = VNode::depth(pVVar7);
  local_88 = streams;
  RandomStreams::position(streams,iVar4);
  local_b8 = qnode;
  local_70 = QNode::children(qnode);
  local_90 = pVVar7;
  local_b0 = VNode::particles(pVVar7);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppSVar12 = (local_b0->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
             _M_impl.super__Vector_impl_data._M_start;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((local_b0->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
      super__Vector_impl_data._M_finish == ppSVar12) {
    local_c8 = 0.0;
  }
  else {
    local_c8 = 0.0;
    uVar13 = 0;
    do {
      pSVar3 = ppSVar12[uVar13];
      iVar4 = logging::level();
      if ((0 < iVar4) && (iVar4 = logging::level(), 3 < iVar4)) {
        plVar8 = logging::stream(4);
        std::__ostream_insert<char,std::char_traits<char>>(&plVar8->super_ostream," Original: ",0xb)
        ;
        poVar9 = despot::operator<<(&plVar8->super_ostream,pSVar3);
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
      }
      iVar4 = (*model->_vptr_DSPOMDP[0x16])(model,pSVar3);
      local_d0 = (State *)CONCAT44(extraout_var,iVar4);
      iVar4 = logging::level();
      if ((0 < iVar4) && (iVar4 = logging::level(), 3 < iVar4)) {
        plVar8 = logging::stream(4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&plVar8->super_ostream," Before step: ",0xe);
        poVar9 = despot::operator<<(&plVar8->super_ostream,local_d0);
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
      }
      pSVar3 = local_d0;
      local_c0 = RandomStreams::Entry(local_88,local_d0->scenario_id);
      uVar5 = QNode::edge(local_b8);
      iVar4 = (*model->_vptr_DSPOMDP[2])(local_c0,model,pSVar3,(ulong)uVar5,&local_a0,&local_68);
      local_c0 = local_a0 * local_d0->weight;
      iVar6 = logging::level();
      if ((0 < iVar6) && (iVar6 = logging::level(), 3 < iVar6)) {
        plVar8 = logging::stream(4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&plVar8->super_ostream," After step: ",0xd);
        poVar9 = despot::operator<<(&plVar8->super_ostream,local_d0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        poVar9 = std::ostream::_M_insert<double>(local_a0 * local_d0->weight);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        poVar9 = std::ostream::_M_insert<double>(local_a0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        poVar9 = std::ostream::_M_insert<double>(local_d0->weight);
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
      }
      if ((char)iVar4 == '\0') {
        this_00 = (vector<despot::State*,std::allocator<despot::State*>> *)
                  std::
                  map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
                  ::operator[]((map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
                                *)&local_60,&local_68);
        __position._M_current = *(State ***)(this_00 + 8);
        if (__position._M_current == *(State ***)(this_00 + 0x10)) {
          std::vector<despot::State*,std::allocator<despot::State*>>::
          _M_realloc_insert<despot::State*const&>(this_00,__position,&local_d0);
        }
        else {
          *__position._M_current = local_d0;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
        }
      }
      else {
        (*model->_vptr_DSPOMDP[0x17])(model,local_d0);
      }
      local_c8 = local_c8 + local_c0;
      uVar13 = uVar13 + 1;
      ppSVar12 = (local_b0->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                 _M_impl.super__Vector_impl_data._M_start;
    } while (uVar13 < (ulong)((long)(local_b0->
                                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar12 >>
                             3));
  }
  iVar4 = VNode::depth(local_90);
  dVar14 = pow(DAT_00193de8,(double)iVar4);
  local_c8 = dVar14 * local_c8 - DAT_00193df0;
  p_Var11 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c0 = local_c8;
  local_98 = local_c8;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    do {
      local_d0 = *(State **)(p_Var11 + 1);
      iVar4 = logging::level();
      if ((0 < iVar4) && (iVar4 = logging::level(), 3 < iVar4)) {
        plVar8 = logging::stream(4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&plVar8->super_ostream," Creating node for obs ",0x17);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)plVar8);
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
      }
      pVVar7 = (VNode *)operator_new(0x98);
      particles = std::
                  map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
                  ::operator[]((map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
                                *)&local_60,(key_type *)&local_d0);
      iVar4 = VNode::depth(local_90);
      VNode::VNode(pVVar7,particles,iVar4 + 1,local_b8,(OBS_TYPE)local_d0);
      iVar4 = logging::level();
      if ((0 < iVar4) && (iVar4 = logging::level(), 3 < iVar4)) {
        plVar8 = logging::stream(4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&plVar8->super_ostream," New node created!",0x12);
        std::ios::widen((char)(plVar8->super_ostream)._vptr_basic_ostream[-3] + (char)plVar8);
        std::ostream::put((char)plVar8);
        std::ostream::flush();
      }
      ppVVar10 = std::
                 map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                 ::operator[](local_70,(key_type *)&local_d0);
      *ppVVar10 = pVVar7;
      iVar4 = QNode::edge(local_b8);
      History::Add(local_a8,iVar4,(OBS_TYPE)local_d0);
      InitBounds(pVVar7,local_80,local_78,local_88,local_a8);
      ppiVar1 = &(local_a8->actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppiVar1 = *ppiVar1 + -1;
      ppuVar2 = &(local_a8->observations_).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar2 = *ppuVar2 + -1;
      iVar4 = logging::level();
      if ((0 < iVar4) && (iVar4 = logging::level(), 3 < iVar4)) {
        plVar8 = logging::stream(4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&plVar8->super_ostream," New node\'s bounds: (",0x15);
        dVar14 = VNode::lower_bound(pVVar7);
        poVar9 = std::ostream::_M_insert<double>(dVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
        dVar14 = VNode::upper_bound(pVVar7);
        poVar9 = std::ostream::_M_insert<double>(dVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,")",1);
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
      }
      local_b0 = (vector<despot::State_*,_std::allocator<despot::State_*>_> *)
                 VNode::lower_bound(pVVar7);
      dVar14 = VNode::upper_bound(pVVar7);
      local_c0 = local_c0 + (double)local_b0;
      local_c8 = local_c8 + dVar14;
      p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
    } while ((_Rb_tree_header *)p_Var11 != &local_60._M_impl.super__Rb_tree_header);
  }
  this = local_b8;
  local_b8->step_reward = local_98;
  QNode::lower_bound(local_b8,local_c0);
  QNode::upper_bound(this,local_c8);
  this->utility_upper_bound = local_c8 + DAT_00193df0;
  this->default_value = local_c0;
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void DESPOT::Expand(QNode* qnode, ScenarioLowerBound* lb,
	ScenarioUpperBound* ub, const DSPOMDP* model,
	RandomStreams& streams,
	History& history) {
	VNode* parent = qnode->parent();
	streams.position(parent->depth());
	map<OBS_TYPE, VNode*>& children = qnode->children();

	const vector<State*>& particles = parent->particles();

	double step_reward = 0;

	// Partition particles by observation
	map<OBS_TYPE, vector<State*> > partitions;
	OBS_TYPE obs;
	double reward;
	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		logd << " Original: " << *particle << endl;

		State* copy = model->Copy(particle);

		logd << " Before step: " << *copy << endl;

		bool terminal = model->Step(*copy, streams.Entry(copy->scenario_id),
			qnode->edge(), reward, obs);

		step_reward += reward * copy->weight;

		logd << " After step: " << *copy << " " << (reward * copy->weight)
			<< " " << reward << " " << copy->weight << endl;

		if (!terminal) {
			partitions[obs].push_back(copy);
		} else {
			model->Free(copy);
		}
	}
	step_reward = Globals::Discount(parent->depth()) * step_reward
		- Globals::config.pruning_constant;//pruning_constant is used for regularization

	double lower_bound = step_reward;
	double upper_bound = step_reward;

	// Create new belief nodes
	for (map<OBS_TYPE, vector<State*> >::iterator it = partitions.begin();
		it != partitions.end(); it++) {
		OBS_TYPE obs = it->first;
		logd << " Creating node for obs " << obs << endl;
		VNode* vnode = new VNode(partitions[obs], parent->depth() + 1,
			qnode, obs);
		logd << " New node created!" << endl;
		children[obs] = vnode;

		history.Add(qnode->edge(), obs);
		InitBounds(vnode, lb, ub, streams, history);
		history.RemoveLast();
		logd << " New node's bounds: (" << vnode->lower_bound() << ", "
			<< vnode->upper_bound() << ")" << endl;

		lower_bound += vnode->lower_bound();
		upper_bound += vnode->upper_bound();
	}

	qnode->step_reward = step_reward;
	qnode->lower_bound(lower_bound);
	qnode->upper_bound(upper_bound);
	qnode->utility_upper_bound = upper_bound + Globals::config.pruning_constant;

	qnode->default_value = lower_bound; // for debugging
}